

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx512::forward
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  uint dilation_w;
  uint dilation_h;
  uint stride_w;
  uint stride_h;
  ulong uVar5;
  int *piVar6;
  bool bVar7;
  int w;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  Layer *pLVar19;
  uint uVar20;
  Option *opt_00;
  uint _elempack;
  uint kernel_h;
  int iVar21;
  uint uVar22;
  int iVar23;
  Option *in_stack_fffffffffffffeb8;
  Mat local_118;
  int local_cc;
  Mat local_c8;
  Mat local_78;
  
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).int8_scale_term != 0)) {
    iVar12 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar12;
  }
  iVar12 = (this->super_Convolution).kernel_w;
  iVar23 = (this->super_Convolution).kernel_h;
  if (iVar23 != 1 || (iVar12 != 1 || bottom_blob->dims != 1)) {
    iVar21 = bottom_blob->c;
    iVar2 = (this->super_Convolution).dilation_w;
    uVar5 = bottom_blob->elemsize;
    iVar3 = (this->super_Convolution).dilation_h;
    iVar4 = bottom_blob->elempack;
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    Convolution::make_padding(&this->super_Convolution,bottom_blob,&local_118,opt);
    w = local_118.w;
    iVar14 = -100;
    if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0)) {
      iVar12 = (~((iVar12 + -1) * iVar2) + local_118.w) / (this->super_Convolution).stride_w + 1;
      local_cc = local_118.h;
      iVar23 = (~((iVar23 + -1) * iVar3) + local_118.h) / (this->super_Convolution).stride_h + 1;
      uVar20 = (this->super_Convolution).num_output;
      _elempack = 1;
      if (opt->use_packing_layout == true) {
        if ((uVar20 & 0xf) == 0) {
          _elempack = 0x10;
        }
        else if ((uVar20 & 7) == 0) {
          _elempack = 8;
        }
        else {
          _elempack = (uint)((uVar20 & 3) == 0) * 3 + 1;
        }
      }
      Mat::create(top_blob,iVar12,iVar23,(int)uVar20 / (int)_elempack,
                  (ulong)_elempack * (uVar5 / (ulong)(long)iVar4),_elempack,opt->blob_allocator);
      iVar2 = local_cc;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (((opt->use_packing_layout == false) &&
            ((((((this->super_Convolution).kernel_w == (this->super_Convolution).kernel_h &&
                (iVar3 = (this->super_Convolution).dilation_w, iVar3 != 1)) &&
               (iVar14 = (this->super_Convolution).dilation_h, iVar14 == iVar3)) &&
              (((this->super_Convolution).stride_w == 1 && ((this->super_Convolution).stride_h == 1)
               ))) && (iVar3 <= iVar12)))) && (iVar14 <= iVar23)) {
          iVar14 = forwardDilation_x86(this,&local_118,top_blob,opt);
        }
        else {
          iVar21 = iVar21 * iVar4;
          bVar11 = opt->use_winograd23_convolution;
          if (((bVar11 == false) && (opt->use_winograd43_convolution == false)) &&
             (opt->use_winograd63_convolution != true)) {
            bVar9 = false;
          }
          else {
            bVar9 = true;
            if (iVar21 < 9) {
              bVar9 = 8 < (this->super_Convolution).num_output;
            }
          }
          auVar1._0_4_ = (this->super_Convolution).kernel_w;
          auVar1._4_4_ = (this->super_Convolution).kernel_h;
          auVar1._8_4_ = (this->super_Convolution).dilation_w;
          auVar1._12_4_ = (this->super_Convolution).dilation_h;
          if ((((auVar1 == _DAT_005c3380) && ((this->super_Convolution).stride_w == 1)) &&
              ((this->super_Convolution).stride_h == 1)) &&
             ((opt->use_winograd_convolution != false && (bVar9)))) {
            iVar12 = (this->super_Convolution).num_output;
            bVar9 = test_prefer_winograd63(iVar21,iVar12,w,local_cc);
            bVar10 = test_prefer_winograd23(iVar21,iVar12,w,iVar2);
            if ((bVar10) &&
               (((bVar11 == false || ((this->weight_winograd23_data).data == (void *)0x0)) ||
                ((long)(this->weight_winograd23_data).c * (this->weight_winograd23_data).cstep == 0)
                ))) {
              bVar11 = true;
              bVar10 = false;
              bVar8 = false;
              if (bVar9) {
LAB_001a12a0:
                bVar8 = false;
                if (((opt->use_winograd63_convolution != true) ||
                    ((this->weight_winograd63_data).data == (void *)0x0)) ||
                   (bVar9 = (long)(this->weight_winograd63_data).c *
                            (this->weight_winograd63_data).cstep == 0, bVar8 = !bVar9,
                   bVar11 || bVar9)) goto LAB_001a12e4;
LAB_001a1339:
                bVar7 = true;
              }
              else {
LAB_001a12e4:
                bVar7 = bVar8;
                if (((opt->use_winograd43_convolution == true) &&
                    ((this->weight_winograd43_data).data != (void *)0x0)) &&
                   (bVar11 = true,
                   (long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep !=
                   0)) goto LAB_001a1344;
                if (((opt->use_winograd63_convolution == true) &&
                    ((this->weight_winograd63_data).data != (void *)0x0)) &&
                   ((long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep !=
                    0)) goto LAB_001a1339;
                bVar10 = true;
              }
              bVar11 = false;
            }
            else {
              if (bVar9) {
                bVar11 = !bVar10 && !bVar9;
                goto LAB_001a12a0;
              }
              bVar7 = false;
              bVar11 = false;
              bVar8 = false;
              if (!bVar10 && !bVar9) goto LAB_001a12e4;
            }
LAB_001a1344:
            iVar12 = this->nT;
            iVar23 = iVar12;
            if (iVar12 == 0) {
              iVar23 = opt->num_threads;
            }
            if (opt->num_threads != iVar12 && iVar12 != 0) {
              forward();
            }
            if (bVar10 == false) {
              if (bVar11) {
                iVar14 = conv3x3s1_winograd43
                                   (&local_118,top_blob,&this->weight_winograd43_data,
                                    &(this->super_Convolution).bias_data,iVar23,opt);
                goto LAB_001a13ec;
              }
              if (bVar7) {
                iVar14 = conv3x3s1_winograd63
                                   (&local_118,top_blob,&this->weight_winograd63_data,
                                    &(this->super_Convolution).bias_data,iVar23,opt);
                goto LAB_001a13ec;
              }
            }
            else {
              iVar14 = conv3x3s1_winograd23
                                 (&local_118,top_blob,&this->weight_winograd23_data,
                                  &(this->super_Convolution).bias_data,iVar23,opt);
LAB_001a13ec:
              if (iVar14 != 0) goto LAB_001a14b1;
            }
            pLVar19 = this->activation;
            iVar14 = 0;
            if (pLVar19 != (Layer *)0x0) {
              (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
            }
          }
          else {
            iVar23 = get_cpu_level2_cache_size();
            iVar12 = (this->super_Convolution).num_output;
            uVar20 = (this->super_Convolution).kernel_w;
            opt_00 = (Option *)(ulong)uVar20;
            kernel_h = (this->super_Convolution).kernel_h;
            dilation_w = (this->super_Convolution).dilation_w;
            dilation_h = (this->super_Convolution).dilation_h;
            stride_w = (this->super_Convolution).stride_w;
            stride_h = (this->super_Convolution).stride_h;
            if (((opt->use_sgemm_convolution == true) &&
                (iVar23 < (int)(stride_w * stride_h *
                                kernel_h * dilation_w * dilation_h * iVar12 * uVar20 * iVar21 * 8)
                 || (0x10 < iVar21 || 0x10 < iVar12))) || (kernel_h == 1 && uVar20 == 1)) {
              iVar12 = this->nT;
              iVar23 = iVar12;
              if (iVar12 == 0) {
                iVar23 = opt->num_threads;
              }
              if (opt->num_threads != iVar12 && iVar12 != 0) {
                fprintf(_stderr,
                        "opt.num_threads %d changed, convolution gemm will use load-time value %d");
                fputc(10,_stderr);
                uVar20 = (this->super_Convolution).kernel_w;
                kernel_h = (this->super_Convolution).kernel_h;
                dilation_w = (this->super_Convolution).dilation_w;
                dilation_h = (this->super_Convolution).dilation_h;
                stride_w = (this->super_Convolution).stride_w;
                stride_h = (this->super_Convolution).stride_h;
              }
              iVar14 = convolution_im2col_gemm
                                 (&local_118,top_blob,&this->weight_sgemm_data,
                                  &(this->super_Convolution).bias_data,uVar20,kernel_h,dilation_w,
                                  dilation_h,stride_w,stride_h,iVar23,opt);
              if (iVar14 == 0) {
                pLVar19 = this->activation;
                iVar14 = 0;
                if (pLVar19 != (Layer *)0x0) {
                  (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
                }
              }
              goto LAB_001a14b1;
            }
            uVar15 = uVar20 ^ 3;
            uVar13 = kernel_h ^ 3;
            uVar16 = dilation_w ^ 1;
            uVar18 = dilation_h ^ 1;
            uVar17 = stride_w ^ 1;
            uVar22 = stride_h ^ 1;
            if ((((iVar4 == 0x10 && (_elempack ^ 1) == 0) && (uVar13 == 0 && uVar15 == 0)) &&
                ((uVar16 == 0 && uVar18 == 0) && uVar17 == 0)) && uVar22 == 0) {
              conv3x3s1_pack16to1_avx512
                        (&local_118,top_blob,&this->weight_data_tm,
                         (Mat *)(this->super_Convolution).bias_data.data,opt_00);
              goto LAB_001a1493;
            }
            if ((iVar4 == 8) && (_elempack == 8)) {
              if ((((uVar13 == 0 && uVar15 == 0) && (uVar16 == 0 && uVar18 == 0)) && uVar17 == 0) &&
                  uVar22 == 0) {
                conv3x3s1_pack8_avx(&local_118,top_blob,&this->weight_data_tm,
                                    (Mat *)(this->super_Convolution).bias_data.data,opt_00);
                goto LAB_001a1493;
              }
              bVar11 = false;
              iVar14 = 0;
              if ((((kernel_h != 2 || uVar20 != 2) || (uVar16 != 0 || uVar18 != 0)) || uVar17 != 0)
                  || uVar22 != 0) goto LAB_001a19c1;
              conv2x2s1_pack8_avx(&local_118,top_blob,&this->weight_data_tm,
                                  (Mat *)(this->super_Convolution).bias_data.data,opt_00);
              pLVar19 = this->activation;
              if (pLVar19 == (Layer *)0x0) goto LAB_001a14b1;
LAB_001a149f:
              (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
            }
            else {
              bVar11 = iVar4 == 1;
              if ((bVar11) && (_elempack == 8)) {
                bVar9 = ((uVar13 != 0 || uVar15 != 0) || uVar16 != 0) || uVar18 != 0;
                if ((stride_w != 1 || stride_h != 1) || bVar9) {
                  bVar11 = true;
                  if (bVar9 || (stride_h != 2 || stride_w != 2)) goto LAB_001a19c1;
                  conv3x3s2_pack1to8_avx
                            (&local_118,top_blob,&this->weight_data_tm,
                             (Mat *)(this->super_Convolution).bias_data.data,opt_00);
                }
                else {
                  conv3x3s1_pack1to8_avx
                            (&local_118,top_blob,&this->weight_data_tm,
                             (Mat *)(this->super_Convolution).bias_data.data,opt_00);
                }
LAB_001a1493:
                pLVar19 = this->activation;
                if (pLVar19 != (Layer *)0x0) goto LAB_001a149f;
              }
              else {
LAB_001a19c1:
                if ((((iVar4 == 8 && (_elempack ^ 1) == 0) && (uVar13 == 0 && uVar15 == 0)) &&
                    ((uVar16 == 0 && uVar18 == 0) && uVar17 == 0)) && uVar22 == 0) {
                  conv3x3s1_pack8to1_avx
                            (&local_118,top_blob,&this->weight_data_tm,
                             (Mat *)(this->super_Convolution).bias_data.data,opt_00);
                  goto LAB_001a1493;
                }
                if (bVar11 && _elempack == 4) {
                  bVar11 = uVar13 != 0 || uVar15 != 0;
                  if ((stride_w != 1 || stride_h != 1) || ((bVar11 || uVar16 != 0) || uVar18 != 0))
                  {
                    if (((bVar11 || uVar16 != 0) || uVar18 != 0) || (stride_h != 2 || stride_w != 2)
                       ) goto LAB_001a1a81;
                    conv3x3s2_pack1to4_sse
                              (&local_118,top_blob,&this->weight_data_tm,
                               (Mat *)(this->super_Convolution).bias_data.data,opt_00);
                  }
                  else {
                    conv3x3s1_pack1to4_sse
                              (&local_118,top_blob,&this->weight_data_tm,
                               (Mat *)(this->super_Convolution).bias_data.data,opt_00);
                  }
                  goto LAB_001a1493;
                }
LAB_001a1a81:
                convolution_packed(&local_118,top_blob,&this->weight_data_tm,
                                   &(this->super_Convolution).bias_data,uVar20,kernel_h,dilation_w,
                                   dilation_h,stride_w,stride_h,
                                   (this->super_Convolution).activation_type,
                                   &(this->super_Convolution).activation_params,
                                   in_stack_fffffffffffffeb8);
              }
            }
            iVar14 = 0;
          }
        }
      }
    }
LAB_001a14b1:
    piVar6 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar6 == (int *)0x0) {
      return iVar14;
    }
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 != 0) {
      return iVar14;
    }
    if (local_118.allocator != (Allocator *)0x0) {
      (*(local_118.allocator)->_vptr_Allocator[3])();
      return iVar14;
    }
    goto joined_r0x001a14e5;
  }
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  if ((bottom_blob->elemsize & 0xf) == 0) {
    if (&local_118 == bottom_blob) {
      local_118.c = bottom_blob->w;
    }
    else {
      piVar6 = bottom_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      local_118.data = bottom_blob->data;
      local_118.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
      local_118.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
      local_118.elemsize = bottom_blob->elemsize;
      local_118.elempack = bottom_blob->elempack;
      local_118.allocator = bottom_blob->allocator;
      local_118.c = bottom_blob->w;
      local_118.d = bottom_blob->d;
    }
    local_118.dims = 3;
    local_118.w = 1;
    local_118.h = 1;
    local_118.cstep = 1;
LAB_001a1558:
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_1_ = 0;
    local_c8.elemsize._1_7_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    iVar14 = (*(this->super_Convolution).super_Layer._vptr_Layer[7])(this,&local_118,&local_c8,opt);
    if (iVar14 == 0) {
      if (((byte)local_c8.elemsize & 0xf) == 0) {
        if (&local_c8 != top_blob) {
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_c8.data;
          top_blob->refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          top_blob->elemsize = CONCAT71(local_c8.elemsize._1_7_,(byte)local_c8.elemsize);
          top_blob->elempack = local_c8.elempack;
          top_blob->allocator = local_c8.allocator;
          top_blob->dims = local_c8.dims;
          top_blob->w = local_c8.w;
          top_blob->h = local_c8.h;
          top_blob->d = local_c8.d;
          top_blob->c = local_c8.c;
          top_blob->cstep = local_c8.cstep;
        }
        top_blob->dims = 1;
        top_blob->w = local_c8.c;
        top_blob->h = 1;
        top_blob->c = 1;
        local_118.cstep = (size_t)local_c8.c;
      }
      else {
        Mat::reshape(&local_78,&local_c8,local_c8.c,opt->blob_allocator);
        if (&local_78 != top_blob) {
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_78.data;
          top_blob->refcount = local_78.refcount;
          top_blob->elemsize = local_78.elemsize;
          top_blob->elempack = local_78.elempack;
          top_blob->allocator = local_78.allocator;
          top_blob->dims = local_78.dims;
          top_blob->w = local_78.w;
          top_blob->h = local_78.h;
          top_blob->d = local_78.d;
          top_blob->c = local_78.c;
          top_blob->cstep = local_78.cstep;
        }
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar14 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_001a17f0;
      }
      iVar14 = 0;
    }
LAB_001a17f0:
    piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    Mat::reshape(&local_c8,bottom_blob,1,1,bottom_blob->w,opt->workspace_allocator);
    piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    local_118.data = local_c8.data;
    local_118.refcount._0_4_ = local_c8.refcount._0_4_;
    local_118.refcount._4_4_ = local_c8.refcount._4_4_;
    local_118.elemsize = CONCAT71(local_c8.elemsize._1_7_,(byte)local_c8.elemsize);
    local_118.elempack = local_c8.elempack;
    local_118.allocator = local_c8.allocator;
    local_118.dims = local_c8.dims;
    local_118.w = local_c8.w;
    local_118.h = local_c8.h;
    local_118.d = local_c8.d;
    local_118.c = local_c8.c;
    local_118.cstep = local_c8.cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar14 = -100;
    if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0))
    goto LAB_001a1558;
  }
  piVar6 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar6 == (int *)0x0) {
    return iVar14;
  }
  LOCK();
  *piVar6 = *piVar6 + -1;
  UNLOCK();
  if (*piVar6 != 0) {
    return iVar14;
  }
  if (local_118.allocator != (Allocator *)0x0) {
    (*(local_118.allocator)->_vptr_Allocator[3])();
    return iVar14;
  }
joined_r0x001a14e5:
  if (local_118.data != (void *)0x0) {
    local_118.allocator = (Allocator *)0x0;
    free(local_118.data);
  }
  return iVar14;
}

Assistant:

int Convolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        Mat bottom_blob_3d;
        if (bottom_blob.elemsize % 16 == 0)
        {
            bottom_blob_3d = bottom_blob;
            bottom_blob_3d.dims = 3;
            bottom_blob_3d.w = 1;
            bottom_blob_3d.h = 1;
            bottom_blob_3d.c = bottom_blob.w;
            bottom_blob_3d.cstep = 1;
        }
        else
        {
            bottom_blob_3d = bottom_blob.reshape(1, 1, bottom_blob.w, opt.workspace_allocator);
            if (bottom_blob_3d.empty())
                return -100;
        }

        Mat top_blob_3d;
        int ret = forward(bottom_blob_3d, top_blob_3d, opt);
        if (ret != 0)
            return ret;

        if (top_blob_3d.elemsize % 16 == 0)
        {
            top_blob = top_blob_3d;
            top_blob.dims = 1;
            top_blob.w = top_blob_3d.c;
            top_blob.h = 1;
            top_blob.c = 1;
            bottom_blob_3d.cstep = top_blob_3d.c;
        }
        else
        {
            top_blob = top_blob_3d.reshape(top_blob_3d.c, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
        }

        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw >= dilation_w && outh >= dilation_h)
        {
            return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
        }
    }

    const int num_input = channels * elempack;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
        bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
        bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

        if (prefer_winograd23 && (!opt.use_winograd23_convolution || weight_winograd23_data.empty()))
        {
            // f23 fallback to f43
            prefer_winograd23 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd63 && (!opt.use_winograd63_convolution || weight_winograd63_data.empty()))
        {
            // f63 fallback to f43
            prefer_winograd63 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd43 && (!opt.use_winograd43_convolution || weight_winograd43_data.empty()))
        {
            // f43 fallback to f63 or f23
            prefer_winograd43 = false;
            if (opt.use_winograd63_convolution && !weight_winograd63_data.empty())
            {
                prefer_winograd63 = true;
            }
            else
            {
                prefer_winograd23 = true;
            }
        }

        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution winograd will use load-time value %d", opt.num_threads, nT);
        }

        int ret = 0;
        if (prefer_winograd23)
        {
            ret = conv3x3s1_winograd23(bottom_blob_bordered, top_blob, weight_winograd23_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd43)
        {
            ret = conv3x3s1_winograd43(bottom_blob_bordered, top_blob, weight_winograd43_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd63)
        {
            ret = conv3x3s1_winograd63(bottom_blob_bordered, top_blob, weight_winograd63_data, bias_data, _nT, opt);
        }
        else
        {
            // should never reach here
        }
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
        }

        int ret = convolution_im2col_gemm(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack16to1_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv2x2s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8to1_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX__

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __SSE2__

    convolution_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);

    return 0;
}